

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O0

bool __thiscall QSystemSemaphore::release(QSystemSemaphore *this,int n)

{
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  bool local_29;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    local_29 = true;
  }
  else if (in_ESI < 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),in_RDI,
               in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    QMessageLogger::warning(&local_28,"QSystemSemaphore::release: n is negative.");
    local_29 = false;
  }
  else {
    std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
    operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_> *
               )0x265385);
    local_29 = QSystemSemaphorePrivate::modifySemaphore
                         ((QSystemSemaphorePrivate *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (int)((ulong)in_RDI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QSystemSemaphore::release(int n)
{
    if (n == 0)
        return true;
    if (n < 0) {
        qWarning("QSystemSemaphore::release: n is negative.");
        return false;
    }
    return d->modifySemaphore(n);
}